

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O1

void __thiscall clipp::group::depth_first_traverser::undo(depth_first_traverser *this,memento *m)

{
  pointer *ppcVar1;
  int iVar2;
  pointer pcVar3;
  child_t<clipp::parameter,_clipp::group> *pcVar4;
  context *pcVar5;
  pointer pcVar6;
  size_type __n;
  long lVar7;
  context *pcVar8;
  pointer pcVar9;
  context *pcVar10;
  int iVar11;
  pointer pcVar13;
  int iVar12;
  
  iVar2 = m->level_;
  if (0 < (long)iVar2) {
    pcVar6 = (this->stack_).
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar13 = (this->stack_).
              super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    iVar12 = (int)((ulong)((long)pcVar13 - (long)pcVar6) >> 3);
    iVar11 = iVar12 * -0x55555555;
    if (iVar2 == iVar11 || SBORROW4(iVar2,iVar11) != iVar2 + iVar12 * 0x55555555 < 0) {
      if ((pcVar6 + iVar2 != pcVar13) &&
         (pcVar3 = (this->stack_).
                   super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
         pcVar6 = (pointer)((long)(pcVar6 + iVar2) + ((long)pcVar3 - (long)pcVar13)),
         pcVar3 != pcVar6)) {
        (this->stack_).
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_finish = pcVar6;
      }
      pcVar6 = (this->stack_).
               super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pcVar6[-1].end._M_current = (m->context_).end._M_current;
      pcVar4 = (m->context_).cur._M_current;
      pcVar6[-1].parent = (m->context_).parent;
      pcVar6[-1].cur._M_current = pcVar4;
      return;
    }
    if (iVar2 == 1 && pcVar6 == pcVar13) {
      if (pcVar13 ==
          (this->stack_).
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n = std::
              vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
              ::_M_check_len(&this->stack_,1,"vector::_M_realloc_insert");
        pcVar6 = (this->stack_).
                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar3 = (this->stack_).
                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar7 = (long)pcVar13 - (long)pcVar6 >> 3;
        if (__n == 0) {
          pcVar8 = (context *)0x0;
        }
        else {
          pcVar8 = __gnu_cxx::new_allocator<clipp::group::depth_first_traverser::context>::allocate
                             ((new_allocator<clipp::group::depth_first_traverser::context> *)this,
                              __n,(void *)0x0);
        }
        (&pcVar8->end)[lVar7]._M_current = (m->context_).end._M_current;
        pcVar4 = (m->context_).cur._M_current;
        (&pcVar8->parent)[lVar7] = (m->context_).parent;
        ((const_iterator *)(&pcVar8->parent + lVar7 + 1))->_M_current = pcVar4;
        pcVar10 = pcVar8;
        for (pcVar9 = pcVar6; pcVar9 != pcVar13; pcVar9 = pcVar9 + 1) {
          (pcVar10->end)._M_current = (pcVar9->end)._M_current;
          pcVar4 = (pcVar9->cur)._M_current;
          pcVar10->parent = pcVar9->parent;
          (pcVar10->cur)._M_current = pcVar4;
          pcVar10 = pcVar10 + 1;
        }
        for (; pcVar5 = pcVar10 + 1, pcVar3 != pcVar13; pcVar13 = pcVar13 + 1) {
          pcVar10[1].end._M_current = (pcVar13->end)._M_current;
          pcVar4 = (pcVar13->cur)._M_current;
          pcVar5->parent = pcVar13->parent;
          pcVar10[1].cur._M_current = pcVar4;
          pcVar10 = pcVar5;
        }
        if (pcVar6 != (pointer)0x0) {
          operator_delete(pcVar6);
        }
        (this->stack_).
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start = pcVar8;
        (this->stack_).
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_finish = pcVar5;
        (this->stack_).
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pcVar8 + __n;
        return;
      }
      (pcVar13->end)._M_current = (m->context_).end._M_current;
      pcVar4 = (m->context_).cur._M_current;
      pcVar13->parent = (m->context_).parent;
      (pcVar13->cur)._M_current = pcVar4;
      ppcVar1 = &(this->stack_).
                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
  }
  return;
}

Assistant:

void undo(const memento& m) {
            if(m.level_ < 1) return;
            if(m.level_ <= int(stack_.size())) {
                stack_.erase(stack_.begin() + m.level_, stack_.end());
                stack_.back() = m.context_;
            }
            else if(stack_.empty() && m.level_ == 1) {
                stack_.push_back(m.context_);
            }
        }